

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

int get_request(curl_socket_t sock,httprequest *req)

{
  uint uVar1;
  byte bVar2;
  unsigned_short uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  uint *puVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  long *plVar11;
  int *piVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  size_t __n;
  size_t sVar19;
  bool bVar20;
  int prot_minor;
  int prot_major;
  char *endp;
  char logbuf [456];
  uint local_220;
  uint local_21c;
  char *local_218;
  char *local_210;
  ulong local_208;
  byte *local_200;
  char local_1f8 [456];
  
  if (req->pipelining == false) {
    uVar10 = req->offset;
    if (uVar10 < 149999) {
LAB_001061de:
      if (req->skip == 0) {
        sVar8 = 149999 - uVar10;
      }
      else {
        sVar8 = req->cl;
      }
      lVar5 = recv(sock,req->reqbuf + uVar10,sVar8,0);
      goto LAB_00106203;
    }
LAB_00106c75:
    pcVar15 = "Request would overflow buffer, closing connection";
LAB_00106c7c:
    logmsg(pcVar15);
    req->reqbuf[149999] = '\0';
    uVar1 = 0xffffffff;
LAB_00106c90:
    uVar14 = uVar1;
    storerequest(req->reqbuf,(&req->checkindex)[req->pipelining ^ 1]);
LAB_00106caa:
    uVar14 = -(uint)(got_exit_signal != 0) | uVar14;
  }
  else {
    sVar19 = req->checkindex;
    req->pipelining = false;
    __n = req->offset - sVar19;
    req->checkindex = 0;
    req->offset = 0;
    if (req == (httprequest *)0x0 || __n == 0) {
      uVar10 = 0;
      goto LAB_001061de;
    }
    memmove(req,req->reqbuf + sVar19,__n);
    lVar5 = curlx_uztosz(__n);
LAB_00106203:
    if (got_exit_signal != 0) {
      return -1;
    }
    if (lVar5 == 0) {
      logmsg("Connection closed by client");
    }
    else {
      if (-1 < lVar5) {
        logmsg("Read %zd bytes",lVar5);
        sVar19 = lVar5 + req->offset;
        req->offset = sVar19;
        req->reqbuf[sVar19] = '\0';
        pcVar15 = req->reqbuf + req->checkindex;
        pcVar6 = strstr(pcVar15,end_of_headers);
        iVar4 = req->callcount;
        req->callcount = iVar4 + 1;
        pcVar13 = "";
        if (0 < iVar4) {
          pcVar13 = " [CONTINUED]";
        }
        logmsg("Process %d bytes request%s",req->offset,pcVar13);
        if (use_gopher == '\x01') {
          if (req->testno != -4) goto LAB_00106435;
          iVar4 = strncmp("/verifiedserver",pcVar15,0xf);
          if (iVar4 != 0) goto LAB_00106365;
          logmsg("Are-we-friendly question received");
          req->testno = -2;
LAB_00106c21:
          bVar20 = true;
LAB_00106c24:
          req->done_processing = (uint)bVar20;
          if (got_exit_signal != 0) {
            return -1;
          }
          if ((bVar20 != false) && (req->pipe != 0)) {
            logmsg("Waiting for another piped request");
            req->done_processing = 0;
            req->pipe = req->pipe + -1;
          }
        }
        else {
          if (req->testno == -4) {
LAB_00106365:
            iVar4 = __isoc99_sscanf(pcVar15,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                                    &ProcessRequest_doc,&local_21c,&local_220);
            uVar1 = local_220;
            if (iVar4 != 4) goto LAB_00106435;
            local_208 = (ulong)local_21c;
            req->prot_version = local_220 + local_21c * 10;
            local_218 = pcVar6;
            pcVar6 = strrchr(&ProcessRequest_doc,0x2f);
            local_210 = pcVar6;
            if (pcVar6 != (char *)0x0) {
              sVar8 = strlen(&ProcessRequest_doc);
              sVar9 = strlen(ProcessRequest_request);
              if (sVar9 + sVar8 < 400) {
                curl_msnprintf(local_1f8,0x1c8,"Got request: %s %s HTTP/%d.%d",
                               ProcessRequest_request,&ProcessRequest_doc,local_208,uVar1);
              }
              else {
                curl_msnprintf(local_1f8,0x1c8,"Got a *HUGE* request HTTP/%d.%d",local_208);
              }
              logmsg("%s",local_1f8);
              iVar4 = strncmp("/verifiedserver",pcVar6,0xf);
              if (iVar4 == 0) {
                lVar5 = -2;
                pcVar15 = "Are-we-friendly question received";
              }
              else {
                iVar4 = strncmp("/quit",pcVar6,5);
                if (iVar4 != 0) {
                  do {
                    pcVar6 = pcVar6 + 1;
                    if (*pcVar6 == 0) break;
                    iVar4 = Curl_isdigit((uint)(byte)*pcVar6);
                  } while (iVar4 == 0);
                  local_210 = pcVar6;
                  uVar10 = strtol(pcVar6,&local_210,10);
                  req->testno = uVar10;
                  if (10000 < (long)uVar10) {
                    req->partno = uVar10 % 10000;
                    req->testno = uVar10 / 10000;
                    uVar10 = uVar10 / 10000;
LAB_0010659e:
                    curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld",uVar10);
                    logmsg("%s",local_1f8);
                    parse_servercmd(req);
                    goto LAB_001065d2;
                  }
                  req->partno = 0;
                  if (uVar10 != 0) goto LAB_0010659e;
                  req->testno = -4;
                  goto LAB_001065e5;
                }
                lVar5 = -3;
                pcVar15 = "Request-to-quit received";
              }
              logmsg(pcVar15);
              req->testno = lVar5;
              goto LAB_00106c21;
            }
LAB_001065d2:
            pcVar6 = local_218;
            if (req->testno == -4) {
LAB_001065e5:
              pcVar6 = local_218;
              iVar4 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,
                                      &local_21c);
              if (iVar4 == 3) {
                curl_msnprintf(local_1f8,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",
                               &ProcessRequest_doc,(ulong)local_21c,(ulong)local_220);
                logmsg("%s");
                req->connect_request = true;
                if (req->prot_version == 10) {
                  req->open = false;
                }
                if (ProcessRequest_doc == '[') {
                  if (DAT_0010e781 == 0) {
                    uVar10 = 0;
                  }
                  else {
                    uVar10 = 0;
                    pbVar18 = &DAT_0010e781;
                    bVar2 = DAT_0010e781;
                    do {
                      iVar4 = Curl_isxdigit((uint)bVar2);
                      if (((iVar4 == 0) && (bVar2 = *pbVar18, bVar2 != 0x2e)) && (bVar2 != 0x3a)) {
                        if (bVar2 == 0x5d) {
                          if (pbVar18[1] == 0x3a) {
                            pbVar18 = pbVar18 + 1;
                            goto LAB_0010671d;
                          }
                          pcVar6 = "Invalid CONNECT IPv6 port format";
                          goto LAB_00106713;
                        }
                        break;
                      }
                      uVar10 = strtoul((char *)pbVar18,(char **)&local_200,0x10);
                      iVar4 = Curl_isxdigit((uint)*pbVar18);
                      pbVar17 = local_200;
                      if (iVar4 == 0) {
                        pbVar17 = pbVar18 + 1;
                      }
                      bVar2 = *pbVar17;
                      pbVar18 = pbVar17;
                    } while (bVar2 != 0);
                  }
                  pcVar6 = "Invalid CONNECT IPv6 address format";
LAB_00106713:
                  pbVar18 = (byte *)0x0;
                  logmsg(pcVar6);
LAB_0010671d:
                  req->testno = uVar10;
                }
                else {
                  pbVar18 = (byte *)strchr(&ProcessRequest_doc,0x3a);
                }
                pcVar6 = local_218;
                if (((pbVar18 != (byte *)0x0) && (pbVar18[1] != 0)) &&
                   (iVar4 = Curl_isdigit((uint)pbVar18[1]), iVar4 != 0)) {
                  uVar10 = strtoul((char *)(pbVar18 + 1),(char **)0x0,10);
                  if (uVar10 - 0x10000 < 0xffffffffffff0001) {
                    logmsg("Invalid CONNECT port received");
                  }
                  else {
                    uVar3 = curlx_ultous(uVar10);
                    req->connect_port = uVar3;
                  }
                }
                logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,req->testno
                      );
              }
              if (req->testno == -4) {
                pcVar13 = strstr(pcVar15,"\nTestno: ");
                if (pcVar13 != (char *)0x0) {
                  lVar5 = strtol(pcVar13 + 9,(char **)0x0,10);
                  req->testno = lVar5;
                  logmsg("Found test number %d in Testno: header!",lVar5);
                  if (req->testno != -4) goto LAB_001068f9;
                }
                pcVar13 = strrchr(&ProcessRequest_doc,0x2e);
                if (pcVar13 != (char *)0x0) {
                  local_210 = pcVar13 + 1;
                  uVar10 = strtol(local_210,&local_210,10);
                  req->testno = uVar10;
                  if ((long)uVar10 < 0x2711) {
                    req->partno = 0;
                  }
                  else {
                    req->partno = uVar10 % 10000;
                    req->testno = uVar10 / 10000;
                    logmsg("found test %d in requested host name",uVar10 / 10000);
                    uVar10 = req->testno;
                  }
                  curl_msnprintf(local_1f8,0x1c8,
                                 "Requested test number %ld part %ld (from host name)",uVar10);
                  logmsg("%s",local_1f8);
                  pcVar6 = local_218;
                  if (req->testno == 0) {
                    logmsg("Did not find test number in PATH");
                    req->testno = -1;
                    goto LAB_001068f9;
                  }
                }
                parse_servercmd(req);
              }
            }
          }
          else {
LAB_00106435:
            if ((2 < req->offset) && (req->testno == -4)) {
              logmsg("** Unusual request. Starts with %02x %02x %02x",(ulong)(uint)(int)*pcVar15,
                     (ulong)(uint)(int)pcVar15[1],(ulong)(uint)(int)pcVar15[2]);
            }
          }
LAB_001068f9:
          if (pcVar6 != (char *)0x0) {
            logmsg("- request found to be complete");
            if ((use_gopher == '\x01') && (pcVar13 = strrchr(pcVar15,0x2f), pcVar13 != (char *)0x0))
            {
              do {
                pcVar13 = pcVar13 + 1;
                if (*pcVar13 == 0) break;
                iVar4 = Curl_isdigit((uint)(byte)*pcVar13);
              } while (iVar4 == 0);
              local_210 = pcVar13;
              uVar10 = strtol(pcVar13,&local_210,10);
              if ((long)uVar10 < 0x2711) {
                uVar16 = 0;
              }
              else {
                uVar16 = uVar10 % 10000;
                uVar10 = uVar10 / 10000;
              }
              req->testno = uVar10;
              req->partno = uVar16;
              curl_msnprintf(local_1f8,0x1c8,"Requested GOPHER test number %ld part %ld");
              logmsg("%s",local_1f8);
            }
            if (req->pipe != 0) {
              sVar8 = strlen(end_of_headers);
              req->checkindex = (size_t)(pcVar6 + req->checkindex + (sVar8 - (long)pcVar15));
            }
            bVar20 = true;
LAB_00106a40:
            if (got_exit_signal != 0) goto LAB_00106c24;
            if ((req->cl != 0) ||
               (iVar4 = Curl_strncasecompare("Content-Length:",pcVar15,0xf), iVar4 == 0)) {
              iVar4 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar15,0x1a);
              if (iVar4 == 0) goto code_r0x00106a87;
              pcVar15 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
              bVar20 = pcVar15 != (char *)0x0;
              goto LAB_00106c24;
            }
            bVar2 = pcVar15[0xf];
            pcVar15 = pcVar15 + 0xf;
            while ((bVar2 != 0 && (iVar4 = Curl_isspace((uint)bVar2), iVar4 != 0))) {
              bVar2 = pcVar15[1];
              pcVar15 = pcVar15 + 1;
            }
            local_210 = pcVar15;
            piVar12 = __errno_location();
            *piVar12 = 0;
            uVar10 = strtoul(pcVar15,&local_210,10);
            if (((pcVar15 == local_210) ||
                (iVar4 = Curl_isspace((uint)(byte)*local_210), iVar4 == 0)) || (*piVar12 == 0x22)) {
              logmsg("Found invalid Content-Length: (%s) in the request",pcVar15);
              req->open = false;
              goto LAB_00106c21;
            }
            req->cl = uVar10 - (long)req->skip;
            logmsg("Found Content-Length: %lu in the request",uVar10);
            if (req->skip != 0) {
              logmsg("... but will abort after %zu bytes",req->cl);
            }
LAB_00106a9d:
            if (((req->auth == false) &&
                (pcVar15 = strstr(req->reqbuf,"Authorization:"), pcVar15 != (char *)0x0)) &&
               (req->auth = true, req->auth_req == true)) {
              logmsg("Authorization header found, as required");
            }
            pcVar15 = strstr(req->reqbuf,"Authorization: Negotiate");
            if (pcVar15 == (char *)0x0) {
              if ((req->digest == false) &&
                 (pcVar15 = strstr(req->reqbuf,"Authorization: Digest"), pcVar15 != (char *)0x0)) {
                sVar19 = req->partno + 1000;
                req->partno = sVar19;
                req->digest = true;
                pcVar15 = "Received Digest request, sending back data %ld";
              }
              else if (req->ntlm == false) {
                pcVar15 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
                if (pcVar15 == (char *)0x0) {
                  pcVar15 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
                  if (pcVar15 == (char *)0x0) goto LAB_00106d1b;
                  sVar19 = req->partno + 0x3e9;
                  req->partno = sVar19;
                  req->ntlm = true;
                  pcVar15 = "Received NTLM type-1, sending back data %ld";
                }
                else {
                  req->partno = req->partno + 0x3ea;
                  req->ntlm = true;
                  logmsg("Received NTLM type-3, sending back data %ld");
                  sVar19 = req->cl;
                  if (sVar19 == 0) goto LAB_00106e47;
                  pcVar15 = "  Expecting %zu POSTed bytes";
                }
              }
              else {
LAB_00106d1b:
                lVar5 = req->partno;
                if ((lVar5 < 1000) ||
                   (pcVar15 = strstr(req->reqbuf,"Authorization: Basic"), pcVar15 == (char *)0x0))
                goto LAB_00106e47;
                sVar19 = lVar5 + 1;
                req->partno = sVar19;
                pcVar15 = "Received Basic request, sending back data %ld";
              }
              logmsg(pcVar15,sVar19);
            }
            else {
              logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
                     ProcessRequest_prev_partno);
              if (req->testno == ProcessRequest_prev_testno) {
                plVar11 = &ProcessRequest_prev_partno;
              }
              else {
                plVar11 = &req->partno;
                ProcessRequest_prev_testno = req->testno;
              }
              ProcessRequest_prev_partno = *plVar11 + 1;
              req->partno = ProcessRequest_prev_partno;
            }
LAB_00106e47:
            pcVar15 = strstr(req->reqbuf,"Connection: close");
            if (pcVar15 != (char *)0x0) {
              req->open = false;
            }
            pcVar15 = end_of_headers;
            iVar4 = req->pipe;
            if (iVar4 == 0) {
              if (((((req->open == true) && (10 < req->prot_version)) &&
                   (sVar19 = req->offset, sVar8 = strlen(end_of_headers),
                   pcVar6 + sVar8 < req->reqbuf + sVar19)) && (req->cl == 0)) &&
                 ((((req->reqbuf[0] == 'G' && (req->reqbuf[1] == 'E')) && (req->reqbuf[2] == 'T'))
                  || (iVar4 = strncmp(req->reqbuf,"HEAD",4), iVar4 == 0)))) {
                req->checkindex = (size_t)(pcVar6 + (sVar8 - (long)req));
                req->pipelining = true;
              }
            }
            else {
              do {
                iVar4 = iVar4 + -1;
                if (got_exit_signal != 0) goto LAB_00106c21;
                sVar19 = req->checkindex;
                pcVar6 = strstr(req->reqbuf + sVar19,pcVar15);
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = (char *)0x0;
                  break;
                }
                sVar8 = strlen(pcVar15);
                req->checkindex = (size_t)(pcVar6 + sVar8 + (sVar19 - (long)(req->reqbuf + sVar19)))
                ;
                req->pipe = iVar4;
              } while (iVar4 != 0);
            }
            bVar20 = true;
            if ((req->auth_req == true) && (req->auth == false)) {
              logmsg("Return early due to auth requested by none provided");
            }
            else {
              if ((req->upgrade == true) &&
                 (pcVar15 = strstr(req->reqbuf,"Upgrade:"), pcVar15 != (char *)0x0)) {
                logmsg("Found Upgrade: in request and allows it");
                req->upgrade_request = true;
              }
              uVar10 = req->cl;
              if (uVar10 != 0) {
                sVar19 = req->offset;
                sVar8 = strlen(end_of_headers);
                bVar20 = uVar10 <= (long)req + (sVar19 - (long)(pcVar6 + sVar8));
              }
            }
            goto LAB_00106c24;
          }
          logmsg("request not complete yet");
          req->done_processing = 0;
          if (got_exit_signal != 0) {
            return -1;
          }
        }
        uVar10 = req->offset;
        if (uVar10 == 149999) goto LAB_00106c75;
        if (149999 < uVar10) {
          pcVar15 = "Request buffer overflow, closing connection";
          goto LAB_00106c7c;
        }
        req->reqbuf[uVar10] = '\0';
        uVar14 = 1;
        uVar1 = 1;
        if (req->done_processing != 0) goto LAB_00106c90;
        goto LAB_00106caa;
      }
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      if (uVar1 == 0xb) {
        return 0;
      }
      pcVar15 = strerror(uVar1);
      logmsg("recv() returned error: (%d) %s",(ulong)uVar1,pcVar15);
    }
    req->reqbuf[req->offset] = '\0';
    storerequest(req->reqbuf,req->offset);
    uVar14 = 0xffffffff;
  }
  return uVar14;
code_r0x00106a87:
  pcVar13 = strchr(pcVar15,10);
  pcVar15 = pcVar13 + 1;
  if (pcVar13 == (char *)0x0) goto LAB_00106a9d;
  goto LAB_00106a40;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int error;
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  char *pipereq = NULL;
  size_t pipereq_length = 0;

  if(req->pipelining) {
    pipereq = reqbuf + req->checkindex;
    pipereq_length = req->offset - req->checkindex;

    /* Now that we've got the pipelining info we can reset the
       pipelining-related vars which were skipped in init_httprequest */
    req->pipelining = FALSE;
    req->checkindex = 0;
    req->offset = 0;
  }

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(pipereq_length && pipereq) {
      memmove(reqbuf, pipereq, pipereq_length);
      got = curlx_uztosz(pipereq_length);
      pipereq_length = 0;
    }
    else {
      if(req->skip)
        /* we are instructed to not read the entire thing, so we make sure to
           only read what we're supposed to and NOT read the enire thing the
           client wants to send! */
        got = sread(sock, reqbuf + req->offset, req->cl);
      else
        got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);
    }
    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
    if(req->done_processing && req->pipe) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe--;
    }
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->pipelining ? req->checkindex : req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}